

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O1

int amqpvalue_get_attach(AMQP_VALUE value,ATTACH_HANDLE *attach_handle)

{
  bool bVar1;
  int iVar2;
  AMQP_TYPE AVar3;
  int iVar4;
  ATTACH_HANDLE pAVar5;
  AMQP_VALUE pAVar6;
  AMQP_VALUE pAVar7;
  uint32_t list_item_count;
  char *name;
  AMQP_VALUE offered_capabilities_array;
  int local_48;
  uint local_44;
  AMQP_VALUE local_40;
  AMQP_VALUE local_38;
  
  pAVar5 = (ATTACH_HANDLE)malloc(8);
  if (pAVar5 == (ATTACH_HANDLE)0x0) {
    *attach_handle = (ATTACH_HANDLE)0x0;
    iVar4 = 0xdef;
  }
  else {
    pAVar5->composite_value = (AMQP_VALUE)0x0;
    *attach_handle = pAVar5;
    pAVar6 = amqpvalue_get_inplace_described_value(value);
    if (pAVar6 == (AMQP_VALUE)0x0) {
      attach_destroy(*attach_handle);
      iVar4 = 0xdf7;
    }
    else {
      iVar2 = amqpvalue_get_list_item_count(pAVar6,&local_44);
      iVar4 = 0xdfe;
      if (iVar2 == 0) {
        if (local_44 == 0) {
          iVar4 = 0xe2b;
        }
        else {
          pAVar7 = amqpvalue_get_list_item(pAVar6,0);
          if (pAVar7 == (AMQP_VALUE)0x0) {
            attach_destroy(*attach_handle);
            iVar4 = 0xe0d;
          }
          else {
            AVar3 = amqpvalue_get_type(pAVar7);
            if (AVar3 == AMQP_TYPE_NULL) {
              amqpvalue_destroy(pAVar7);
              attach_destroy(*attach_handle);
              iVar4 = 0xe17;
            }
            else {
              iVar4 = amqpvalue_get_string(pAVar7,(char **)&local_40);
              if (iVar4 == 0) {
                amqpvalue_destroy(pAVar7);
                iVar4 = 0xe54;
                if (1 < local_44) {
                  pAVar7 = amqpvalue_get_list_item(pAVar6,1);
                  if (pAVar7 == (AMQP_VALUE)0x0) {
                    attach_destroy(*attach_handle);
                    iVar4 = 0xe36;
                  }
                  else {
                    AVar3 = amqpvalue_get_type(pAVar7);
                    if (AVar3 == AMQP_TYPE_NULL) {
                      amqpvalue_destroy(pAVar7);
                      attach_destroy(*attach_handle);
                      iVar4 = 0xe40;
                    }
                    else {
                      iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40);
                      if (iVar4 == 0) {
                        local_48 = 0xe21;
                        amqpvalue_destroy(pAVar7);
                        iVar4 = 0xe7d;
                        if (2 < local_44) {
                          pAVar7 = amqpvalue_get_list_item(pAVar6,2);
                          if (pAVar7 == (AMQP_VALUE)0x0) {
                            attach_destroy(*attach_handle);
                            iVar4 = 0xe5f;
                          }
                          else {
                            AVar3 = amqpvalue_get_type(pAVar7);
                            if (AVar3 == AMQP_TYPE_NULL) {
                              amqpvalue_destroy(pAVar7);
                              attach_destroy(*attach_handle);
                              iVar4 = 0xe69;
                            }
                            else {
                              iVar4 = amqpvalue_get_boolean(pAVar7,(_Bool *)&local_40);
                              if (iVar4 == 0) {
                                amqpvalue_destroy(pAVar7);
                                if ((3 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,3),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_ubyte(pAVar7,(uchar *)&local_40),
                                     iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    attach_destroy(*attach_handle);
                                    return 0xe95;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((4 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,4),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_ubyte(pAVar7,(uchar *)&local_40),
                                     iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    attach_destroy(*attach_handle);
                                    return 0xeb2;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((5 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,5),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((6 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,6),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((7 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,7),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_map(pAVar7,&local_40), iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    attach_destroy(*attach_handle);
                                    return 0xee9;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((8 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,8),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_boolean(pAVar7,(_Bool *)&local_40),
                                     iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    attach_destroy(*attach_handle);
                                    return 0xf06;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((9 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,9),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_uint(pAVar7,(uint32_t *)&local_40),
                                     iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    attach_destroy(*attach_handle);
                                    return 0xf23;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((10 < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,10),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_ulong(pAVar7,(uint64_t *)&local_40),
                                     iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar7);
                                    attach_destroy(*attach_handle);
                                    return 0xf40;
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((0xb < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,0xb),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if (AVar3 != AMQP_TYPE_NULL) {
                                    local_40 = (AMQP_VALUE)0x0;
                                    AVar3 = amqpvalue_get_type(pAVar7);
                                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                                        (iVar4 = amqpvalue_get_array(pAVar7,&local_38), iVar4 == 0))
                                       || (iVar4 = amqpvalue_get_symbol(pAVar7,(char **)&local_40),
                                          iVar4 == 0)) {
                                      bVar1 = true;
                                    }
                                    else {
                                      amqpvalue_destroy(pAVar7);
                                      attach_destroy(*attach_handle);
                                      local_48 = 0xf5f;
                                      bVar1 = false;
                                    }
                                    if (!bVar1) {
                                      return local_48;
                                    }
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((0xc < local_44) &&
                                   (pAVar7 = amqpvalue_get_list_item(pAVar6,0xc),
                                   pAVar7 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar7);
                                  if (AVar3 != AMQP_TYPE_NULL) {
                                    local_40 = (AMQP_VALUE)0x0;
                                    AVar3 = amqpvalue_get_type(pAVar7);
                                    if (((AVar3 == AMQP_TYPE_ARRAY) &&
                                        (iVar4 = amqpvalue_get_array(pAVar7,&local_38), iVar4 == 0))
                                       || (iVar4 = amqpvalue_get_symbol(pAVar7,(char **)&local_40),
                                          iVar4 == 0)) {
                                      bVar1 = true;
                                    }
                                    else {
                                      amqpvalue_destroy(pAVar7);
                                      attach_destroy(*attach_handle);
                                      local_48 = 0xf7e;
                                      bVar1 = false;
                                    }
                                    if (!bVar1) {
                                      return local_48;
                                    }
                                  }
                                  amqpvalue_destroy(pAVar7);
                                }
                                if ((0xd < local_44) &&
                                   (pAVar6 = amqpvalue_get_list_item(pAVar6,0xd),
                                   pAVar6 != (AMQP_VALUE)0x0)) {
                                  AVar3 = amqpvalue_get_type(pAVar6);
                                  if ((AVar3 != AMQP_TYPE_NULL) &&
                                     (iVar4 = amqpvalue_get_map(pAVar6,&local_40), iVar4 != 0)) {
                                    amqpvalue_destroy(pAVar6);
                                    attach_destroy(*attach_handle);
                                    return 0xf9b;
                                  }
                                  amqpvalue_destroy(pAVar6);
                                }
                                pAVar6 = amqpvalue_clone(value);
                                pAVar5->composite_value = pAVar6;
                                iVar4 = 0;
                              }
                              else {
                                amqpvalue_destroy(pAVar7);
                                attach_destroy(*attach_handle);
                                local_48 = 0xe73;
                                iVar4 = local_48;
                              }
                            }
                          }
                        }
                      }
                      else {
                        amqpvalue_destroy(pAVar7);
                        attach_destroy(*attach_handle);
                        iVar4 = 0xe4a;
                      }
                    }
                  }
                }
              }
              else {
                amqpvalue_destroy(pAVar7);
                attach_destroy(*attach_handle);
                iVar4 = 0xe21;
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int amqpvalue_get_attach(AMQP_VALUE value, ATTACH_HANDLE* attach_handle)
{
    int result;
    ATTACH_INSTANCE* attach_instance = (ATTACH_INSTANCE*)attach_create_internal();
    *attach_handle = attach_instance;
    if (*attach_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            attach_destroy(*attach_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {
                    AMQP_VALUE item_value;
                    /* name */
                    if (list_item_count > 0)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 0);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                const char* name;
                                if (amqpvalue_get_string(item_value, &name) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* handle */
                    if (list_item_count > 1)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 1);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                handle handle;
                                if (amqpvalue_get_handle(item_value, &handle) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* role */
                    if (list_item_count > 2)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 2);
                        if (item_value == NULL)
                        {
                            {
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                amqpvalue_destroy(item_value);
                                attach_destroy(*attach_handle);
                                result = MU_FAILURE;
                                break;
                            }
                            else
                            {
                                role role;
                                if (amqpvalue_get_role(item_value, &role) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    else
                    {
                        result = MU_FAILURE;
                        break;
                    }
                    /* snd-settle-mode */
                    if (list_item_count > 3)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 3);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sender_settle_mode snd_settle_mode;
                                if (amqpvalue_get_sender_settle_mode(item_value, &snd_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* rcv-settle-mode */
                    if (list_item_count > 4)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 4);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                receiver_settle_mode rcv_settle_mode;
                                if (amqpvalue_get_receiver_settle_mode(item_value, &rcv_settle_mode) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* source */
                    if (list_item_count > 5)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 5);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* target */
                    if (list_item_count > 6)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 6);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* unsettled */
                    if (list_item_count > 7)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 7);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                AMQP_VALUE unsettled;
                                if (amqpvalue_get_map(item_value, &unsettled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* incomplete-unsettled */
                    if (list_item_count > 8)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 8);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                bool incomplete_unsettled;
                                if (amqpvalue_get_boolean(item_value, &incomplete_unsettled) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* initial-delivery-count */
                    if (list_item_count > 9)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 9);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                sequence_no initial_delivery_count;
                                if (amqpvalue_get_sequence_no(item_value, &initial_delivery_count) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* max-message-size */
                    if (list_item_count > 10)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 10);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                uint64_t max_message_size;
                                if (amqpvalue_get_ulong(item_value, &max_message_size) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* offered-capabilities */
                    if (list_item_count > 11)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 11);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* offered_capabilities = NULL;
                                AMQP_VALUE offered_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &offered_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &offered_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* desired-capabilities */
                    if (list_item_count > 12)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 12);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                const char* desired_capabilities = NULL;
                                AMQP_VALUE desired_capabilities_array;
                                if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, &desired_capabilities_array) != 0)) &&
                                    (amqpvalue_get_symbol(item_value, &desired_capabilities) != 0))
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }
                    /* properties */
                    if (list_item_count > 13)
                    {
                        item_value = amqpvalue_get_list_item(list_value, 13);
                        if (item_value == NULL)
                        {
                            /* do nothing */
                        }
                        else
                        {
                            if (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL)
                            {
                                /* no error, field is not mandatory */
                            }
                            else
                            {
                                fields properties;
                                if (amqpvalue_get_fields(item_value, &properties) != 0)
                                {
                                    amqpvalue_destroy(item_value);
                                    attach_destroy(*attach_handle);
                                    result = MU_FAILURE;
                                    break;
                                }
                            }

                            amqpvalue_destroy(item_value);
                        }
                    }

                    attach_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}